

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * bu_dian_pao_abi_cxx11_(void)

{
  int iVar1;
  mapped_type mVar2;
  mapped_type *pmVar3;
  string *in_RDI;
  string local_378;
  string local_358;
  string local_338;
  int local_314;
  undefined1 local_310 [4];
  int i_5;
  string local_2f0;
  string local_2d0;
  int local_2ac;
  undefined1 local_2a8 [4];
  int i_4;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  int local_184;
  mapped_type local_180;
  int i_3;
  int max_card_num;
  string local_158;
  int local_134;
  undefined1 local_130 [4];
  int i_2;
  string local_110;
  int local_ec;
  undefined1 local_e8 [4];
  int i_1;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_38;
  int local_14;
  int i;
  string *most_card;
  
  getAllCard();
  setMyCard(my_player_id);
  for (local_14 = 1; local_14 < 10; local_14 = local_14 + 1) {
    makeCardName_abi_cxx11_(&local_38,'W',local_14);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&my_active_card_abi_cxx11_,&local_38);
    iVar1 = *pmVar3;
    std::__cxx11::string::~string((string *)&local_38);
    if (iVar1 == 0) {
      makeCardName_abi_cxx11_(&local_68,'W',local_14);
      pmVar3 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&all_rest_card_abi_cxx11_,&local_68);
      *pmVar3 = -1;
      std::__cxx11::string::~string((string *)&local_68);
    }
    makeCardName_abi_cxx11_(&local_88,'B',local_14);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&my_active_card_abi_cxx11_,&local_88);
    iVar1 = *pmVar3;
    std::__cxx11::string::~string((string *)&local_88);
    if (iVar1 == 0) {
      makeCardName_abi_cxx11_(&local_a8,'B',local_14);
      pmVar3 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&all_rest_card_abi_cxx11_,&local_a8);
      *pmVar3 = -1;
      std::__cxx11::string::~string((string *)&local_a8);
    }
    makeCardName_abi_cxx11_(&local_c8,'T',local_14);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&my_active_card_abi_cxx11_,&local_c8);
    iVar1 = *pmVar3;
    std::__cxx11::string::~string((string *)&local_c8);
    if (iVar1 == 0) {
      makeCardName_abi_cxx11_((string *)local_e8,'T',local_14);
      pmVar3 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&all_rest_card_abi_cxx11_,(string *)local_e8);
      *pmVar3 = -1;
      std::__cxx11::string::~string((string *)local_e8);
    }
  }
  for (local_ec = 1; local_ec < 5; local_ec = local_ec + 1) {
    makeCardName_abi_cxx11_(&local_110,'F',local_ec);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&my_active_card_abi_cxx11_,&local_110);
    iVar1 = *pmVar3;
    std::__cxx11::string::~string((string *)&local_110);
    if (iVar1 == 0) {
      makeCardName_abi_cxx11_((string *)local_130,'F',local_ec);
      pmVar3 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&all_rest_card_abi_cxx11_,(string *)local_130);
      *pmVar3 = -1;
      std::__cxx11::string::~string((string *)local_130);
    }
  }
  for (local_134 = 1; local_134 < 4; local_134 = local_134 + 1) {
    makeCardName_abi_cxx11_(&local_158,'J',local_134);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&my_active_card_abi_cxx11_,&local_158);
    iVar1 = *pmVar3;
    std::__cxx11::string::~string((string *)&local_158);
    if (iVar1 == 0) {
      makeCardName_abi_cxx11_((string *)&max_card_num,'J',local_134);
      pmVar3 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&all_rest_card_abi_cxx11_,(string *)&max_card_num);
      *pmVar3 = -1;
      std::__cxx11::string::~string((string *)&max_card_num);
    }
  }
  i_3._3_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"error",(allocator *)((long)&i_3 + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_3 + 2));
  local_180 = -1;
  for (local_184 = 1; local_184 < 10; local_184 = local_184 + 1) {
    makeCardName_abi_cxx11_(&local_1a8,'B',local_184);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&my_active_card_abi_cxx11_,&local_1a8);
    mVar2 = local_180;
    iVar1 = *pmVar3;
    std::__cxx11::string::~string((string *)&local_1a8);
    if (mVar2 < iVar1) {
      makeCardName_abi_cxx11_(&local_1c8,'B',local_184);
      pmVar3 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&my_active_card_abi_cxx11_,&local_1c8);
      local_180 = *pmVar3;
      std::__cxx11::string::~string((string *)&local_1c8);
      makeCardName_abi_cxx11_(&local_1e8,'B',local_184);
      std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    makeCardName_abi_cxx11_(&local_208,'W',local_184);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&my_active_card_abi_cxx11_,&local_208);
    mVar2 = local_180;
    iVar1 = *pmVar3;
    std::__cxx11::string::~string((string *)&local_208);
    if (mVar2 < iVar1) {
      makeCardName_abi_cxx11_(&local_228,'W',local_184);
      pmVar3 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&my_active_card_abi_cxx11_,&local_228);
      local_180 = *pmVar3;
      std::__cxx11::string::~string((string *)&local_228);
      makeCardName_abi_cxx11_(&local_248,'W',local_184);
      std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_248);
      std::__cxx11::string::~string((string *)&local_248);
    }
    makeCardName_abi_cxx11_(&local_268,'T',local_184);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&my_active_card_abi_cxx11_,&local_268);
    mVar2 = local_180;
    iVar1 = *pmVar3;
    std::__cxx11::string::~string((string *)&local_268);
    if (mVar2 < iVar1) {
      makeCardName_abi_cxx11_(&local_288,'T',local_184);
      pmVar3 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&my_active_card_abi_cxx11_,&local_288);
      local_180 = *pmVar3;
      std::__cxx11::string::~string((string *)&local_288);
      makeCardName_abi_cxx11_((string *)local_2a8,'T',local_184);
      std::__cxx11::string::operator=((string *)in_RDI,(string *)local_2a8);
      std::__cxx11::string::~string((string *)local_2a8);
    }
  }
  for (local_2ac = 1; local_2ac < 5; local_2ac = local_2ac + 1) {
    makeCardName_abi_cxx11_(&local_2d0,'F',local_2ac);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&my_active_card_abi_cxx11_,&local_2d0);
    mVar2 = local_180;
    iVar1 = *pmVar3;
    std::__cxx11::string::~string((string *)&local_2d0);
    if (mVar2 < iVar1) {
      makeCardName_abi_cxx11_(&local_2f0,'F',local_2ac);
      pmVar3 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&my_active_card_abi_cxx11_,&local_2f0);
      local_180 = *pmVar3;
      std::__cxx11::string::~string((string *)&local_2f0);
      makeCardName_abi_cxx11_((string *)local_310,'F',local_2ac);
      std::__cxx11::string::operator=((string *)in_RDI,(string *)local_310);
      std::__cxx11::string::~string((string *)local_310);
    }
  }
  for (local_314 = 1; local_314 < 4; local_314 = local_314 + 1) {
    makeCardName_abi_cxx11_(&local_338,'J',local_314);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&my_active_card_abi_cxx11_,&local_338);
    mVar2 = local_180;
    iVar1 = *pmVar3;
    std::__cxx11::string::~string((string *)&local_338);
    if (mVar2 < iVar1) {
      makeCardName_abi_cxx11_(&local_358,'J',local_314);
      pmVar3 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&my_active_card_abi_cxx11_,&local_358);
      local_180 = *pmVar3;
      std::__cxx11::string::~string((string *)&local_358);
      makeCardName_abi_cxx11_(&local_378,'J',local_314);
      std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_378);
      std::__cxx11::string::~string((string *)&local_378);
    }
  }
  return in_RDI;
}

Assistant:

string bu_dian_pao() {
    //有一个all_rest_card的map
    getAllCard();
    setMyCard(my_player_id);
    //先把我没有的牌删了,即all_rest_card记为-1，接下来就输出all_rest_card比较多的牌
    for (int i = 1; i <= 9; i++) {
        if (my_active_card[makeCardName('W', i)] == 0) {
            all_rest_card[makeCardName('W', i)] = -1;
        }
        if (my_active_card[makeCardName('B', i)] == 0) {
            all_rest_card[makeCardName('B', i)] = -1;
        }
        if (my_active_card[makeCardName('T', i)] == 0) {
            all_rest_card[makeCardName('T', i)] = -1;
        }
    }
    for (int i = 1; i <= 4; i++) {
        if (my_active_card[makeCardName('F', i)] == 0) {
            all_rest_card[makeCardName('F', i)] = -1;
        }
    }
    for (int i = 1; i <= 3; i++) {
        if (my_active_card[makeCardName('J', i)] == 0) {
            all_rest_card[makeCardName('J', i)] = -1;
        }
    }
    string most_card = "error";
    int max_card_num = -1;

    for (int i = 1; i <= 9; i++) {
        if (my_active_card[makeCardName('B', i)] > max_card_num) {
            max_card_num = my_active_card[makeCardName('B', i)];
            most_card = makeCardName('B', i);
        }
        if (my_active_card[makeCardName('W', i)] > max_card_num) {
            max_card_num = my_active_card[makeCardName('W', i)];
            most_card = makeCardName('W', i);
        }
        if (my_active_card[makeCardName('T', i)] > max_card_num) {
            max_card_num = my_active_card[makeCardName('T', i)];
            most_card = makeCardName('T', i);
        }
    }
    for (int i = 1; i <= 4; i++) {
        if (my_active_card[makeCardName('F', i)] > max_card_num) {
            max_card_num = my_active_card[makeCardName('F', i)];
            most_card = makeCardName('F', i);
        }
    }
    for (int i = 1; i <= 3; i++) {
        if (my_active_card[makeCardName('J', i)] > max_card_num) {
            max_card_num = my_active_card[makeCardName('J', i)];
            most_card = makeCardName('J', i);
        }
    }
    return most_card;
}